

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_vector.hpp
# Opt level: O2

void __thiscall duckdb::SelectionVector::Initialize(SelectionVector *this,idx_t count)

{
  SelectionData *pSVar1;
  shared_ptr<duckdb::SelectionData,_true> local_30;
  idx_t local_20;
  
  local_20 = count;
  make_shared_ptr<duckdb::SelectionData,unsigned_long&>((unsigned_long *)&local_30);
  shared_ptr<duckdb::SelectionData,_true>::operator=(&this->selection_data,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pSVar1 = shared_ptr<duckdb::SelectionData,_true>::operator->(&this->selection_data);
  this->sel_vector = *(sel_t **)(pSVar1 + 8);
  return;
}

Assistant:

void Initialize(idx_t count = STANDARD_VECTOR_SIZE) {
		selection_data = make_shared_ptr<SelectionData>(count);
		sel_vector = reinterpret_cast<sel_t *>(selection_data->owned_data.get());
	}